

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O2

void envy_bios_print_xpiodir(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar2 = (bios->gpio).xpiodir.offset;
  if (uVar2 != 0) {
    bVar1 = (bios->gpio).xpiodir.version;
    uVar5 = (ulong)(bVar1 >> 4);
    uVar3 = (ulong)(bVar1 & 0xf);
    if ((bios->gpio).xpiodir.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse XPIODIR table at 0x%04x version %d.%d\n\n",(ulong)uVar2,
              uVar5,uVar3);
      return;
    }
    lVar4 = 0;
    fprintf((FILE *)out,"XPIODIR table at 0x%04x version %d.%d, %d subtables\n",(ulong)uVar2,uVar5,
            uVar3,(ulong)(bios->gpio).xpiodir.entriesnum);
    envy_bios_dump_hex(bios,out,(uint)(bios->gpio).xpiodir.offset,
                       (uint)(bios->gpio).xpiodir.rlen * (uint)(bios->gpio).xpiodir.entriesnum +
                       (uint)(bios->gpio).xpiodir.hlen,mask);
    fputc(10,(FILE *)out);
    for (uVar5 = 0; uVar5 < (bios->gpio).xpiodir.entriesnum; uVar5 = uVar5 + 1) {
      envy_bios_print_xpio
                (bios,out,(envy_bios_xpio *)((long)&((bios->gpio).xpiodir.entries)->offset + lVar4),
                 (int)uVar5,mask);
      lVar4 = lVar4 + 0x18;
    }
  }
  return;
}

Assistant:

void envy_bios_print_xpiodir (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_xpiodir *xpiodir = &bios->gpio.xpiodir;
	if (!xpiodir->offset)
		return;
	if (!xpiodir->valid) {
		fprintf(out, "Failed to parse XPIODIR table at 0x%04x version %d.%d\n\n", xpiodir->offset, xpiodir->version >> 4, xpiodir->version & 0xf);
		return;
	}
	fprintf(out, "XPIODIR table at 0x%04x version %d.%d, %d subtables\n", xpiodir->offset, xpiodir->version >> 4, xpiodir->version & 0xf, xpiodir->entriesnum);
	envy_bios_dump_hex(bios, out, xpiodir->offset, xpiodir->hlen + xpiodir->entriesnum * xpiodir->rlen, mask);
	fprintf(out, "\n");
	int i;
	for (i = 0; i < xpiodir->entriesnum; i++)
		envy_bios_print_xpio(bios, out, &xpiodir->entries[i], i, mask);
}